

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O3

void __thiscall TCLAP::Arg::~Arg(Arg *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

inline Arg::~Arg() { }